

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O1

void __thiscall
helics::MessageFederateManager::removeOrderedMessage(MessageFederateManager *this,uint index)

{
  uint *puVar1;
  pointer puVar2;
  pointer puVar3;
  size_t __n;
  pointer puVar4;
  pointer __src;
  handle handle;
  handle local_28;
  
  gmlc::libguarded::
  guarded_opt<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::mutex>::lock
            (&local_28,&this->messageOrder);
  puVar2 = ((local_28.data)->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  puVar3 = puVar2 + -1;
  if (puVar2[-1] != index) {
    __n = 0xfffffffffffffffc;
    __src = puVar2 + 1;
    do {
      puVar4 = __src;
      if (puVar3 == ((local_28.data)->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start) goto LAB_001e774a;
      __src = puVar4 + -1;
      __n = __n + 4;
      puVar1 = puVar3 + -1;
      puVar3 = puVar3 + -1;
    } while (*puVar1 != index);
    if (__src != puVar2) {
      memmove(puVar4 + -2,__src,__n);
    }
    puVar3 = ((local_28.data)->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_finish + -1;
  }
  ((local_28.data)->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = puVar3;
LAB_001e774a:
  std::unique_lock<std::mutex>::~unique_lock(&local_28.m_handle_lock);
  return;
}

Assistant:

void MessageFederateManager::removeOrderedMessage(unsigned int index)
{
    auto handle = messageOrder.lock();
    if (index == handle->back()) {
        handle->pop_back();
    } else {
        auto term = handle->rend();
        for (auto ri = handle->rbegin() + 1; ri != term; ++ri) {
            if (*ri == index) {
                handle->erase(ri.base());
                break;
            }
        }
    }
}